

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.cpp
# Opt level: O1

void __thiscall
HFactor::setupGeneral
          (HFactor *this,HighsInt num_col_,HighsInt num_row_,HighsInt num_basic_,HighsInt *a_start_,
          HighsInt *a_index_,double *a_value_,HighsInt *basic_index_,double pivot_threshold_,
          double pivot_tolerance_,HighsInt highs_debug_level_,HighsLogOptions *log_options_,
          bool use_original_HFactor_logic_,HighsInt update_method_)

{
  int *piVar1;
  LogData *pLVar2;
  HighsInt *pHVar3;
  pointer piVar4;
  uint uVar5;
  uint uVar6;
  LogData *pLVar7;
  int iVar8;
  FILE *pFVar9;
  long lVar10;
  int iVar11;
  size_type sVar12;
  undefined1 auVar13 [16];
  value_type_conflict1 local_38;
  
  this->num_row = num_row_;
  this->num_col = num_col_;
  this->num_basic = num_basic_;
  this->inv_num_row = 1.0 / (double)num_row_;
  this->a_matrix_valid = true;
  this->a_start = a_start_;
  this->a_index = a_index_;
  this->a_value = a_value_;
  this->basic_index = basic_index_;
  auVar13._8_8_ = pivot_tolerance_;
  auVar13._0_8_ = pivot_threshold_;
  auVar13 = minpd(_DAT_003df8d0,auVar13);
  auVar13 = maxpd(auVar13,ZEXT816(0x3f4a36e2eb1c432d));
  this->pivot_threshold = (double)auVar13._0_8_;
  this->pivot_tolerance = (double)auVar13._8_8_;
  this->highs_debug_level = highs_debug_level_;
  this->time_limit_ = INFINITY;
  pLVar7 = (LogData *)operator_new(8);
  pLVar7->output_flag = false;
  pLVar7->log_to_console = false;
  *(undefined2 *)&pLVar7->field_0x2 = 0;
  pLVar7->log_dev_level = 0;
  pLVar2 = (this->log_data)._M_t.
           super___uniq_ptr_impl<HFactor::LogData,_std::default_delete<HFactor::LogData>_>._M_t.
           super__Tuple_impl<0UL,_HFactor::LogData_*,_std::default_delete<HFactor::LogData>_>.
           super__Head_base<0UL,_HFactor::LogData_*,_false>._M_head_impl;
  (this->log_data)._M_t.
  super___uniq_ptr_impl<HFactor::LogData,_std::default_delete<HFactor::LogData>_>._M_t.
  super__Tuple_impl<0UL,_HFactor::LogData_*,_std::default_delete<HFactor::LogData>_>.
  super__Head_base<0UL,_HFactor::LogData_*,_false>._M_head_impl = pLVar7;
  if (pLVar2 != (LogData *)0x0) {
    operator_delete(pLVar2);
  }
  pLVar2 = (this->log_data)._M_t.
           super___uniq_ptr_impl<HFactor::LogData,_std::default_delete<HFactor::LogData>_>._M_t.
           super__Tuple_impl<0UL,_HFactor::LogData_*,_std::default_delete<HFactor::LogData>_>.
           super__Head_base<0UL,_HFactor::LogData_*,_false>._M_head_impl;
  (this->log_options).output_flag = &pLVar2->output_flag;
  (this->log_options).log_to_console = &pLVar2->log_to_console;
  (this->log_options).log_dev_level = &pLVar2->log_dev_level;
  if (log_options_ == (HighsLogOptions *)0x0) {
    pLVar2->output_flag = false;
    pLVar2->log_to_console = true;
    pLVar2->log_dev_level = 0;
    pFVar9 = (FILE *)0x0;
  }
  else {
    pLVar2->output_flag = *log_options_->output_flag;
    pLVar2->log_to_console = *log_options_->log_to_console;
    pLVar2->log_dev_level = *log_options_->log_dev_level;
    pFVar9 = log_options_->log_stream;
  }
  (this->log_options).log_stream = pFVar9;
  this->use_original_HFactor_logic = use_original_HFactor_logic_;
  this->update_method = update_method_;
  std::vector<int,_std::allocator<int>_>::reserve(&this->iwork,(long)this->num_row * 2);
  local_38 = 0.0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&this->dwork,(long)this->num_row,&local_38);
  this->basis_matrix_limit_size = 0;
  local_38 = (value_type_conflict1)((ulong)local_38 & 0xffffffff00000000);
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->iwork,(long)this->num_row + 1,(value_type_conflict2 *)&local_38);
  if (0 < this->num_col) {
    pHVar3 = this->a_start;
    piVar4 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      piVar1 = piVar4 + ((long)pHVar3[lVar10 + 1] - (long)pHVar3[lVar10]);
      *piVar1 = *piVar1 + 1;
      lVar10 = lVar10 + 1;
    } while (lVar10 < this->num_col);
  }
  uVar6 = this->num_row;
  uVar5 = this->num_basic;
  if (this->num_basic < (int)uVar6) {
    uVar5 = uVar6;
  }
  if (0 < (int)uVar5 && -1 < (int)uVar6) {
    iVar11 = this->basis_matrix_limit_size;
    piVar4 = (this->iwork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar8 = 0;
    do {
      iVar11 = piVar4[uVar6] * uVar6 + iVar11;
      this->basis_matrix_limit_size = iVar11;
      if ((int)uVar6 < 1) break;
      iVar8 = iVar8 + piVar4[uVar6];
      uVar6 = uVar6 - 1;
    } while (iVar8 < (int)uVar5);
  }
  this->basis_matrix_limit_size = this->basis_matrix_limit_size + uVar5;
  std::vector<int,_std::allocator<int>_>::resize(&this->b_var,(long)(int)uVar5);
  local_38 = (value_type_conflict1)((ulong)local_38 & 0xffffffff00000000);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->b_start,(long)(int)(uVar5 + 1),(value_type_conflict2 *)&local_38);
  std::vector<int,_std::allocator<int>_>::resize(&this->b_index,(long)this->basis_matrix_limit_size)
  ;
  std::vector<double,_std::allocator<double>_>::resize
            (&this->b_value,(long)this->basis_matrix_limit_size);
  iVar11 = this->num_basic;
  if (this->num_basic < this->num_row) {
    iVar11 = this->num_row;
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->permute,(long)iVar11);
  sVar12 = (size_type)this->num_basic;
  std::vector<int,_std::allocator<int>_>::resize(&this->mc_var,sVar12);
  std::vector<int,_std::allocator<int>_>::resize(&this->mc_start,sVar12);
  std::vector<int,_std::allocator<int>_>::resize(&this->mc_count_a,sVar12);
  std::vector<int,_std::allocator<int>_>::resize(&this->mc_count_n,sVar12);
  std::vector<int,_std::allocator<int>_>::resize(&this->mc_space,sVar12);
  std::vector<double,_std::allocator<double>_>::resize(&this->mc_min_pivot,sVar12);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->mc_index,(long)this->basis_matrix_limit_size * 2);
  std::vector<double,_std::allocator<double>_>::resize
            (&this->mc_value,(long)this->basis_matrix_limit_size * 2);
  std::vector<int,_std::allocator<int>_>::resize(&this->mr_start,(long)this->num_row);
  std::vector<int,_std::allocator<int>_>::resize(&this->mr_count,(long)this->num_row);
  std::vector<int,_std::allocator<int>_>::resize(&this->mr_space,(long)this->num_row);
  std::vector<int,_std::allocator<int>_>::resize(&this->mr_count_before,(long)this->num_row);
  std::vector<int,_std::allocator<int>_>::resize
            (&this->mr_index,(long)this->basis_matrix_limit_size * 2);
  local_38 = (value_type_conflict1)((ulong)local_38 & 0xffffffffffffff00);
  std::vector<char,_std::allocator<char>_>::_M_fill_assign
            (&this->mwz_column_mark,(long)this->num_row,(value_type *)&local_38);
  std::vector<int,_std::allocator<int>_>::resize(&this->mwz_column_index,(long)this->num_row);
  local_38 = 0.0;
  std::vector<double,_std::allocator<double>_>::_M_fill_assign
            (&this->mwz_column_array,(long)this->num_row,&local_38);
  iVar11 = this->num_basic;
  local_38._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->col_link_first,(long)this->num_row + 1,(value_type_conflict2 *)&local_38);
  std::vector<int,_std::allocator<int>_>::resize(&this->col_link_next,(long)iVar11);
  std::vector<int,_std::allocator<int>_>::resize(&this->col_link_last,(long)iVar11);
  iVar11 = this->num_row;
  sVar12 = (long)this->num_basic + 1;
  std::vector<int,_std::allocator<int>_>::resize(&this->row_link_first,sVar12);
  local_38 = (value_type_conflict1)CONCAT44(local_38._4_4_,0xffffffff);
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&this->row_link_first,sVar12,(value_type_conflict2 *)&local_38);
  std::vector<int,_std::allocator<int>_>::resize(&this->row_link_next,(long)iVar11);
  std::vector<int,_std::allocator<int>_>::resize(&this->row_link_last,(long)iVar11);
  std::vector<int,_std::allocator<int>_>::resize(&this->l_pivot_lookup,(long)this->num_row);
  std::vector<int,_std::allocator<int>_>::reserve(&this->l_pivot_index,(long)this->num_row);
  std::vector<int,_std::allocator<int>_>::reserve(&this->l_start,(long)this->num_row + 1);
  std::vector<int,_std::allocator<int>_>::reserve
            (&this->l_index,(long)this->basis_matrix_limit_size * 3);
  std::vector<double,_std::allocator<double>_>::reserve
            (&this->l_value,(long)this->basis_matrix_limit_size * 3);
  std::vector<int,_std::allocator<int>_>::reserve(&this->lr_start,(long)this->num_row + 1);
  std::vector<int,_std::allocator<int>_>::reserve
            (&this->lr_index,(long)this->basis_matrix_limit_size * 3);
  std::vector<double,_std::allocator<double>_>::reserve
            (&this->lr_value,(long)this->basis_matrix_limit_size * 3);
  std::vector<int,_std::allocator<int>_>::resize(&this->u_pivot_lookup,(long)this->num_row);
  std::vector<int,_std::allocator<int>_>::reserve(&this->u_pivot_index,(long)this->num_row + 1000);
  std::vector<double,_std::allocator<double>_>::reserve
            (&this->u_pivot_value,(long)this->num_row + 1000);
  std::vector<int,_std::allocator<int>_>::reserve(&this->u_start,(long)this->num_row + 0x3e9);
  std::vector<int,_std::allocator<int>_>::reserve(&this->u_last_p,(long)this->num_row + 1000);
  std::vector<int,_std::allocator<int>_>::reserve
            (&this->u_index,(long)this->basis_matrix_limit_size * 3);
  std::vector<double,_std::allocator<double>_>::reserve
            (&this->u_value,(long)this->basis_matrix_limit_size * 3);
  std::vector<int,_std::allocator<int>_>::reserve(&this->ur_start,(long)this->num_row + 0x3e9);
  std::vector<int,_std::allocator<int>_>::reserve(&this->ur_lastp,(long)this->num_row + 1000);
  std::vector<int,_std::allocator<int>_>::reserve(&this->ur_space,(long)this->num_row + 1000);
  std::vector<int,_std::allocator<int>_>::reserve
            (&this->ur_index,(long)this->basis_matrix_limit_size * 3);
  std::vector<double,_std::allocator<double>_>::reserve
            (&this->ur_value,(long)this->basis_matrix_limit_size * 3);
  std::vector<double,_std::allocator<double>_>::reserve(&this->pf_pivot_value,1000);
  std::vector<int,_std::allocator<int>_>::reserve(&this->pf_pivot_index,1000);
  std::vector<int,_std::allocator<int>_>::reserve(&this->pf_start,0x7d1);
  std::vector<int,_std::allocator<int>_>::reserve
            (&this->pf_index,(long)this->basis_matrix_limit_size << 2);
  std::vector<double,_std::allocator<double>_>::reserve
            (&this->pf_value,(long)this->basis_matrix_limit_size << 2);
  HVectorBase<double>::setup(&this->rhs_,this->num_row);
  (this->rhs_).count = -1;
  return;
}

Assistant:

void HFactor::setupGeneral(
    const HighsInt num_col_, const HighsInt num_row_, HighsInt num_basic_,
    const HighsInt* a_start_, const HighsInt* a_index_, const double* a_value_,
    HighsInt* basic_index_, const double pivot_threshold_,
    const double pivot_tolerance_, const HighsInt highs_debug_level_,
    const HighsLogOptions* log_options_, const bool use_original_HFactor_logic_,
    const HighsInt update_method_) {
  // Copy Problem size and (pointer to) coefficient matrix
  num_row = num_row_;
  num_col = num_col_;
  num_basic = num_basic_;
  inv_num_row = 1.0 / num_row;
  this->a_matrix_valid = true;
  a_start = a_start_;
  a_index = a_index_;
  a_value = a_value_;
  basic_index = basic_index_;
  pivot_threshold =
      max(kMinPivotThreshold, min(pivot_threshold_, kMaxPivotThreshold));
  pivot_tolerance =
      max(kMinPivotTolerance, min(pivot_tolerance_, kMaxPivotTolerance));
  highs_debug_level = highs_debug_level_;
  time_limit_ = kHighsInf;
  log_data = decltype(log_data)(new LogData());
  log_options.output_flag = &log_data->output_flag;
  log_options.log_to_console = &log_data->log_to_console;
  log_options.log_dev_level = &log_data->log_dev_level;

  if (!log_options_) {
    log_data->output_flag = false;
    log_data->log_to_console = true;
    log_data->log_dev_level = 0;
    log_options.log_stream = nullptr;
  } else {
    log_data->output_flag = *(log_options_->output_flag);
    log_data->log_to_console = *(log_options_->log_to_console);
    log_data->log_dev_level = *(log_options_->log_dev_level);
    log_options.log_stream = log_options_->log_stream;
  }

  use_original_HFactor_logic = use_original_HFactor_logic_;
  update_method = update_method_;

  // Allocate for working buffer
  iwork.reserve(num_row * 2);
  dwork.assign(num_row, 0);

  // Find Basis matrix limit size
  basis_matrix_limit_size = 0;

  iwork.assign(num_row + 1, 0);
  for (HighsInt i = 0; i < num_col; i++) iwork[a_start[i + 1] - a_start[i]]++;
  const HighsInt b_max_dim = max(num_row, num_basic);
  for (HighsInt i = num_row, counted = 0; i >= 0 && counted < b_max_dim; i--)
    basis_matrix_limit_size += i * iwork[i], counted += iwork[i];
  basis_matrix_limit_size += b_max_dim;

  // Allocate space for basis matrix, L, U factor and Update buffer
  b_var.resize(b_max_dim);
  b_start.resize(b_max_dim + 1, 0);
  b_index.resize(basis_matrix_limit_size);
  b_value.resize(basis_matrix_limit_size);

  // Allocate space for pivot records
  const HighsInt permute_max_dim = max(num_row, num_basic);
  permute.resize(permute_max_dim);

  // Allocate space for Markowitz matrices
  const HighsInt mc_dim = num_basic;
  mc_var.resize(mc_dim);
  mc_start.resize(mc_dim);
  mc_count_a.resize(mc_dim);
  mc_count_n.resize(mc_dim);
  mc_space.resize(mc_dim);
  mc_min_pivot.resize(mc_dim);
  mc_index.resize(basis_matrix_limit_size * kMCExtraEntriesMultiplier);
  mc_value.resize(basis_matrix_limit_size * kMCExtraEntriesMultiplier);

  mr_start.resize(num_row);
  mr_count.resize(num_row);
  mr_space.resize(num_row);
  mr_count_before.resize(num_row);
  mr_index.resize(basis_matrix_limit_size * kMRExtraEntriesMultiplier);

  mwz_column_mark.assign(num_row, 0);
  mwz_column_index.resize(num_row);
  mwz_column_array.assign(num_row, 0);

  // Allocate space for count-link-list
  const HighsInt col_link_max_count = num_row;
  const HighsInt col_link_dim = num_basic;
  col_link_first.assign(col_link_max_count + 1, -1);
  col_link_next.resize(col_link_dim);
  col_link_last.resize(col_link_dim);

  const HighsInt row_link_max_count = num_basic;
  const HighsInt row_link_dim = num_row;
  // Strictly not necessary, but nice if it's the right size
  row_link_first.resize(row_link_max_count + 1);
  row_link_first.assign(row_link_max_count + 1, -1);
  row_link_next.resize(row_link_dim);
  row_link_last.resize(row_link_dim);

  // Allocate space for L factor
  l_pivot_lookup.resize(num_row);
  l_pivot_index.reserve(num_row);
  l_start.reserve(num_row + 1);
  l_index.reserve(basis_matrix_limit_size * kLFactorExtraEntriesMultiplier);
  l_value.reserve(basis_matrix_limit_size * kLFactorExtraEntriesMultiplier);

  lr_start.reserve(num_row + 1);
  lr_index.reserve(basis_matrix_limit_size * kLFactorExtraEntriesMultiplier);
  lr_value.reserve(basis_matrix_limit_size * kLFactorExtraEntriesMultiplier);

  // Allocate space for U factor
  u_pivot_lookup.resize(num_row);
  u_pivot_index.reserve(num_row + kUFactorExtraVectors);
  u_pivot_value.reserve(num_row + kUFactorExtraVectors);

  u_start.reserve(num_row + kUFactorExtraVectors + 1);
  u_last_p.reserve(num_row + kUFactorExtraVectors);
  u_index.reserve(basis_matrix_limit_size * kUFactorExtraEntriesMultiplier);
  u_value.reserve(basis_matrix_limit_size * kUFactorExtraEntriesMultiplier);

  ur_start.reserve(num_row + kUFactorExtraVectors + 1);
  ur_lastp.reserve(num_row + kUFactorExtraVectors);
  ur_space.reserve(num_row + kUFactorExtraVectors);
  ur_index.reserve(basis_matrix_limit_size * kUFactorExtraEntriesMultiplier);
  ur_value.reserve(basis_matrix_limit_size * kUFactorExtraEntriesMultiplier);

  // Allocate spaces for Update buffer
  pf_pivot_value.reserve(kPFFPivotEntries);
  pf_pivot_index.reserve(kPFFPivotEntries);
  pf_start.reserve(kPFVectors + 1);
  pf_index.reserve(basis_matrix_limit_size * kPFEntriesMultiplier);
  pf_value.reserve(basis_matrix_limit_size * kPFEntriesMultiplier);

  // Set up the local HVector for use when RHS is
  // std::vector<double>.
  rhs_.setup(num_row);
  rhs_.count = -1;
}